

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

void mxx::gatherv<char>(char *data,size_t size,char *out,
                       vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,int root,
                       comm *comm)

{
  pointer puVar1;
  long lVar2;
  long lVar3;
  vector<int,_std::allocator<int>_> counts;
  vector<int,_std::allocator<int>_> displs;
  datatype dt;
  size_t total_size;
  
  total_size = 0;
  for (puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_start;
      puVar1 != (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                _M_impl.super__Vector_impl_data._M_finish; puVar1 = puVar1 + 1) {
    total_size = total_size + *puVar1;
  }
  bcast<unsigned_long>(&total_size,root,comm);
  if (total_size < 0x7fffffff) {
    dt._vptr_datatype = (_func_int **)&PTR__datatype_00152310;
    dt.mpitype = (MPI_Datatype)&ompi_mpi_char;
    dt.builtin = true;
    if (comm->m_rank == root) {
      std::vector<int,_std::allocator<int>_>::vector
                (&counts,(long)comm->m_size,(allocator_type *)&displs);
      puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar2 = (long)(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3;
      if (0 < lVar2) {
        lVar2 = lVar2 + 1;
        lVar3 = 0;
        do {
          *(undefined4 *)
           ((long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start + lVar3) =
               *(undefined4 *)((long)puVar1 + lVar3 * 2);
          lVar2 = lVar2 + -1;
          lVar3 = lVar3 + 4;
        } while (1 < lVar2);
      }
      impl::get_displacements<int>(&displs,&counts);
      MPI_Gatherv(data,size & 0xffffffff,dt.mpitype,out,
                  counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,dt.mpitype,root,comm->mpi_comm);
      if (displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    else {
      MPI_Gatherv(data,size & 0xffffffff,&ompi_mpi_char,0,0,0,&ompi_mpi_char,root,comm->mpi_comm);
    }
    datatype::~datatype(&dt);
  }
  else {
    impl::gatherv_big<char>(data,size,out,recv_sizes,root,comm);
  }
  return;
}

Assistant:

void gatherv(const T* data, size_t size, T* out, const std::vector<size_t>& recv_sizes, int root, const mxx::comm& comm = mxx::comm()) {
    size_t total_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), static_cast<size_t>(0));
    mxx::bcast(total_size, root, comm);
    if (total_size >= mxx::max_int) {
        // use custom implementation for large sizes
        impl::gatherv_big(data, size, out, recv_sizes, root, comm);
    } else {
        // use standard MPI_Gatherv
        mxx::datatype dt = mxx::get_datatype<T>();
        if (comm.rank() == root) {
            std::vector<int> counts(comm.size());
            std::copy(recv_sizes.begin(), recv_sizes.end(), counts.begin());
            std::vector<int> displs = impl::get_displacements(counts);
            MPI_Gatherv(const_cast<T*>(data), size, dt.type(),
                        out, &counts[0], &displs[0], dt.type(), root, comm);
        } else {
            MPI_Gatherv(const_cast<T*>(data), size, dt.type(),
                        NULL, NULL, NULL, dt.type(), root, comm);
        }
    }
}